

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

string * FormatScriptError_abi_cxx11_(ScriptError_t err)

{
  bool bVar1;
  ScriptError_t in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  ScriptErrorDesc *se;
  ScriptErrorDesc *__end1;
  ScriptErrorDesc *__begin1;
  ScriptErrorDesc (*__range1) [43];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[81],_const_char_(&)[81]>
  *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  assertion_result *in_stack_fffffffffffffef8;
  const_string *msg;
  lazy_ostream *in_stack_ffffffffffffff18;
  const_string *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff28;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ScriptErrorDesc *local_a0;
  allocator<char> local_79;
  const_string local_78;
  lazy_ostream local_68 [2];
  assertion_result local_48;
  const_string local_30 [2];
  allocator<char> local_9;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = script_errors;
  do {
    this = in_RDI;
    if (local_a0 == (ScriptErrorDesc *)&PTR_typeinfo_023cf700) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffef8,
                   (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   (unsigned_long)in_stack_fffffffffffffee8);
        msg = local_30;
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffee8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   (size_t)in_stack_ffffffffffffff18,msg);
        boost::test_tools::assertion_result::assertion_result
                  (in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7);
        in_stack_ffffffffffffff18 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   (char (*) [81])in_stack_fffffffffffffee8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffef8,
                   (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   (unsigned_long)in_stack_fffffffffffffee8);
        in_stack_fffffffffffffee8 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[81],_const_char_(&)[81]> *)0x0;
        boost::test_tools::tt_detail::report_assertion(&local_48,local_68,&local_78,0x66,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[81],_const_char_(&)[81]>::
        ~lazy_ostream_impl(in_stack_fffffffffffffee8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffee8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_RDI,in_stack_ffffffffffffff28);
      std::allocator<char>::~allocator(&local_79);
LAB_00a73950:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return this;
    }
    if (local_a0->err == in_ESI) {
      __a = &local_9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
      std::allocator<char>::~allocator(&local_9);
      goto LAB_00a73950;
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

static std::string FormatScriptError(ScriptError_t err)
{
    for (const auto& se : script_errors)
        if (se.err == err)
            return se.name;
    BOOST_ERROR("Unknown scripterror enumeration value, update script_errors in script_tests.cpp.");
    return "";
}